

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_basic_types.h
# Opt level: O0

Lit_t __thiscall Potassco::ProgramReader::matchLit(ProgramReader *this,char *err)

{
  Lit_t LVar1;
  ProgramReader *in_RDI;
  char *unaff_retaddr;
  
  stream(in_RDI);
  LVar1 = Potassco::matchLit((BufferedStream *)this,err._4_4_,unaff_retaddr);
  return LVar1;
}

Assistant:

Lit_t    matchLit(const char* err = "literal expected") { return Potassco::matchLit(*stream(), varMax_, err); }